

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O0

unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> __thiscall
IRT::CEseqFloatVisitor::processRightEseqInCBinop
          (CEseqFloatVisitor *this,CBinopExpression *binop,CExpression *left,
          CEseqExpression *rightEseq)

{
  bool bVar1;
  TOperationType TVar2;
  CStatement *pCVar3;
  CEseqExpression *pCVar4;
  CSeqStatement *this_00;
  CMoveStatement *this_01;
  CTempExpression *pCVar5;
  CBinopExpression *pCVar6;
  CMemExpression *this_02;
  CExpression *pCVar7;
  CEseqExpression *in_R8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_160;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_158;
  undefined1 local_149;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_148;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_140;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_138;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_130;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_128;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_120;
  undefined1 local_111;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_110;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_108;
  undefined1 local_f9;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_f8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_f0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_e8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_e0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_d8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_d0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_c8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_c0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_b8;
  undefined1 local_b0 [8];
  CTemp temp;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_88;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_80;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_78;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_70;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_68;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_60 [3];
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_48;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_40;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_38;
  CEseqExpression *local_30;
  CEseqExpression *rightEseq_local;
  CExpression *left_local;
  CBinopExpression *binop_local;
  CEseqFloatVisitor *this_local;
  
  local_30 = in_R8;
  rightEseq_local = rightEseq;
  left_local = left;
  binop_local = binop;
  this_local = this;
  pCVar3 = CEseqExpression::getStatement(in_R8);
  bVar1 = isExpCommuteWithStm(&rightEseq->super_CExpression,pCVar3);
  if (bVar1) {
    pCVar4 = (CEseqExpression *)operator_new(0x18);
    temp._30_1_ = 1;
    pCVar3 = CEseqExpression::getStatement(local_30);
    (*(pCVar3->super_IStatement).super_INode._vptr_INode[3])(&local_48);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_40,&local_48);
    pCVar6 = (CBinopExpression *)operator_new(0x20);
    temp._31_1_ = 1;
    (*(rightEseq_local->super_CExpression).super_IExpression.super_INode._vptr_INode[3])(&local_78);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_70,&local_78);
    pCVar7 = CEseqExpression::getExpression(local_30);
    (*(pCVar7->super_IExpression).super_INode._vptr_INode[3])(&local_88);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_80,&local_88);
    TVar2 = CBinopExpression::getOperation((CBinopExpression *)left_local);
    CBinopExpression::CBinopExpression(pCVar6,&local_70,&local_80,TVar2);
    temp._31_1_ = 0;
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_68,(pointer)pCVar6);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(local_60,&local_68);
    CEseqExpression::CEseqExpression(pCVar4,&local_40,local_60);
    temp._30_1_ = 0;
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_38,(pointer)pCVar4);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               this,&local_38);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_38);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(local_60);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_68);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_80);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_88);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_70);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_78);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_40);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_48);
  }
  else {
    CTemp::CTemp((CTemp *)local_b0);
    pCVar4 = (CEseqExpression *)operator_new(0x18);
    this_00 = (CSeqStatement *)operator_new(0x18);
    local_111 = 1;
    this_01 = (CMoveStatement *)operator_new(0x18);
    local_f9 = 1;
    pCVar5 = (CTempExpression *)operator_new(0x28);
    CTempExpression::CTempExpression(pCVar5,(CTemp *)local_b0);
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_e8,(pointer)pCVar5);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_e0,&local_e8);
    (*(rightEseq_local->super_CExpression).super_IExpression.super_INode._vptr_INode[3])(&local_f8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_f0,&local_f8);
    CMoveStatement::CMoveStatement(this_01,&local_e0,&local_f0);
    local_f9 = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_d8,(pointer)this_01);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_d0,&local_d8);
    pCVar3 = CEseqExpression::getStatement(local_30);
    (*(pCVar3->super_IStatement).super_INode._vptr_INode[3])(&local_110);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_108,&local_110);
    CSeqStatement::CSeqStatement(this_00,&local_d0,&local_108);
    local_111 = 0;
    std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
    unique_ptr<std::default_delete<IRT::CStatement_const>,void>
              ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
               &local_c8,(pointer)this_00);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
              (&local_c0,&local_c8);
    pCVar6 = (CBinopExpression *)operator_new(0x20);
    this_02 = (CMemExpression *)operator_new(0x10);
    local_149 = 1;
    pCVar5 = (CTempExpression *)operator_new(0x28);
    CTempExpression::CTempExpression(pCVar5,(CTemp *)local_b0);
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_148,(pointer)pCVar5);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_140,&local_148);
    CMemExpression::CMemExpression(this_02,&local_140);
    local_149 = 0;
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_138,(pointer)this_02);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_130,&local_138);
    pCVar7 = CEseqExpression::getExpression(local_30);
    (*(pCVar7->super_IExpression).super_INode._vptr_INode[3])(&local_160);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_158,&local_160);
    TVar2 = CBinopExpression::getOperation((CBinopExpression *)left_local);
    CBinopExpression::CBinopExpression(pCVar6,&local_130,&local_158,TVar2);
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_128,(pointer)pCVar6);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr(&local_120,&local_128);
    CEseqExpression::CEseqExpression(pCVar4,&local_c0,&local_120);
    std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
    unique_ptr<std::default_delete<IRT::CExpression_const>,void>
              ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
               &local_b8,(pointer)pCVar4);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    unique_ptr((unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               this,&local_b8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_b8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_120);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_128);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_158);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_160);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_130);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_138);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_140);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_148);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_c0);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_c8);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_108);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_110);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_d0);
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (&local_d8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_f0);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_f8);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_e0);
    std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::
    ~unique_ptr(&local_e8);
    CTemp::~CTemp((CTemp *)local_b0);
  }
  return (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const IRT::CExpression> IRT::CEseqFloatVisitor::processRightEseqInCBinop(
        const IRT::CBinopExpression *binop,
        const IRT::CExpression *left, const IRT::CEseqExpression *rightEseq) {

    if (isExpCommuteWithStm(left, rightEseq->getStatement())) {
        return EMOVE_UNIQ(new CEseqExpression(
                std::move(rightEseq->getStatement()->Copy()),
                EMOVE_UNIQ(new CBinopExpression(
                        std::move(left->Copy()),
                        std::move(rightEseq->getExpression()->Copy()),
                        binop->getOperation()
                ))
        ));
    } else {
        CTemp temp;
        return EMOVE_UNIQ(new CEseqExpression(
                SMOVE_UNIQ(new CSeqStatement(
                    SMOVE_UNIQ(new CMoveStatement(
                        EMOVE_UNIQ(new CTempExpression(temp)),
                        std::move(left->Copy())
                    )),
                    std::move(rightEseq->getStatement()->Copy())
                )),
                EMOVE_UNIQ(new CBinopExpression(
                        EMOVE_UNIQ(new CMemExpression( EMOVE_UNIQ(new CTempExpression(temp)))),
                        std::move(rightEseq->getExpression()->Copy()),
                        binop->getOperation()
                ))
        ));
    }
}